

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeDeviceReleaseExternalSemaphoreExtPrologue
          (ZEHandleLifetimeValidation *this,ze_external_semaphore_ext_handle_t hSemaphore)

{
  bool bVar1;
  ze_result_t zVar2;
  
  bVar1 = HandleLifetimeValidation::isHandleValid<_ze_external_semaphore_ext_handle_t*>
                    (*(HandleLifetimeValidation **)(context + 0xd48),hSemaphore);
  zVar2 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (bVar1) {
    zVar2 = ZE_RESULT_SUCCESS;
  }
  return zVar2;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeDeviceReleaseExternalSemaphoreExtPrologue(
        ze_external_semaphore_ext_handle_t hSemaphore   ///< [in] The handle of the external semaphore.
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hSemaphore )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }